

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionManager.cpp
# Opt level: O0

void __thiscall SessionManager::SessionManager(SessionManager *this)

{
  MutexFactory *this_00;
  Mutex *pMVar1;
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__SessionManager_00223cc8;
  std::vector<Session_*,_std::allocator<Session_*>_>::vector
            ((vector<Session_*,_std::allocator<Session_*>_> *)0x1e7c4b);
  this_00 = MutexFactory::i();
  pMVar1 = MutexFactory::getMutex(this_00);
  in_RDI[4] = pMVar1;
  return;
}

Assistant:

SessionManager::SessionManager()
{
	sessionsMutex = MutexFactory::i()->getMutex();
}